

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckTemplate.cxx
# Opt level: O2

bool __thiscall kws::Parser::CheckTemplate(Parser *this,char *regEx)

{
  string *psVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  byte bVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  byte bVar9;
  ulong uVar10;
  size_t pos;
  bool bVar11;
  int iVar12;
  string currentWord;
  Error error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  RegularExpression regex;
  
  this->m_TestsDone[0x16] = true;
  std::__cxx11::string::assign((char *)(this->m_TestsDescription + 0x16));
  std::__cxx11::string::append((char *)(this->m_TestsDescription + 0x16));
  kwssys::RegularExpression::RegularExpression(&regex,regEx);
  psVar1 = &this->m_BufferNoComment;
  bVar5 = 0;
  lVar6 = std::__cxx11::string::find((char *)psVar1,0x162130);
  do {
    while( true ) {
      if (lVar6 == -1) {
        kwssys::RegularExpression::~RegularExpression(&regex);
        return (bool)(~bVar5 & 1);
      }
      pcVar3 = (psVar1->_M_dataplus)._M_p;
      cVar2 = pcVar3[lVar6 + -1];
      if ((cVar2 == ' ') || (cVar2 == '\n')) {
        cVar2 = pcVar3[lVar6 + 8];
        bVar11 = cVar2 == '\n' || cVar2 == ' ';
      }
      else {
        bVar11 = false;
      }
      sVar7 = std::__cxx11::string::find((char *)psVar1,0x162488);
      lVar8 = std::__cxx11::string::find((char *)psVar1,0x1619b2);
      if (lVar8 != -1 && sVar7 != 0xffffffffffffffff) break;
LAB_001448b4:
      lVar6 = std::__cxx11::string::find((char *)psVar1,0x162130);
    }
    for (lVar6 = lVar6 + 8; lVar6 < (long)sVar7; lVar6 = lVar6 + 1) {
      uVar10 = (ulong)(byte)(psVar1->_M_dataplus)._M_p[lVar6];
      if ((0x20 < uVar10) || ((0x100002400U >> (uVar10 & 0x3f) & 1) == 0)) goto LAB_001448b4;
    }
    if (!bVar11) goto LAB_001448b4;
    std::__cxx11::string::string((string *)&currentWord,"",(allocator *)&error);
    bVar4 = false;
    bVar11 = false;
    iVar12 = 0;
    while (pos = sVar7 + 1, (long)sVar7 < lVar8) {
      bVar9 = (psVar1->_M_dataplus)._M_p[pos];
      iVar12 = iVar12 + (uint)(bVar9 == 0x3c);
      if (bVar9 - 0x3d < 2) {
LAB_00144931:
        if (currentWord._M_string_length != 0 && !bVar11) {
          bVar11 = kwssys::RegularExpression::find(&regex,currentWord._M_dataplus._M_p);
          if (!bVar11 && iVar12 == 0) {
            error.description._M_dataplus._M_p = (pointer)&error.description.field_2;
            error.description._M_string_length = 0;
            error.description.field_2._M_local_buf[0] = '\0';
            error.line = GetLineNumber(this,pos,true);
            error.number = 0x16;
            error.line2 = error.line;
            std::operator+(&local_2a0,"Template definition (",&currentWord);
            std::operator+(&local_280,&local_2a0,") doesn\'t match regular expression");
            std::__cxx11::string::operator=((string *)&error.description,(string *)&local_280);
            std::__cxx11::string::~string((string *)&local_280);
            std::__cxx11::string::~string((string *)&local_2a0);
            std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                      (&this->m_ErrorList,&error);
            std::__cxx11::string::~string((string *)&error.description);
            bVar5 = 1;
          }
        }
        bVar9 = (psVar1->_M_dataplus)._M_p[pos];
        bVar11 = bVar9 == 0x3d;
LAB_00144a27:
        bVar4 = false;
      }
      else {
        if (bVar9 == 0x20) goto LAB_00144a27;
        if (bVar9 == 0x2c) goto LAB_00144931;
        if (!bVar4) {
          std::__cxx11::string::assign((char *)&currentWord);
        }
        std::__cxx11::string::push_back((char)&currentWord);
        bVar9 = (psVar1->_M_dataplus)._M_p[pos];
        bVar4 = true;
      }
      iVar12 = iVar12 - (uint)(bVar9 == 0x3e);
      sVar7 = pos;
    }
    lVar6 = std::__cxx11::string::find((char *)psVar1,0x162130);
    std::__cxx11::string::~string((string *)&currentWord);
  } while( true );
}

Assistant:

bool Parser::CheckTemplate(const char* regEx)
{
  m_TestsDone[TEMPLATE] = true;
  m_TestsDescription[TEMPLATE] = "Template should match the regex: ";
  m_TestsDescription[TEMPLATE] += regEx;

  kwssys::RegularExpression regex(regEx);

  bool hasErrors = false;
  // We check all the templates in the file
  // Maybe we should separate the main class from the templated function
  // at some point.

  auto templatePos =
      static_cast<long int>(m_BufferNoComment.find("template", 0));
  while(templatePos != -1 ) 
    {
    bool valid = true;

    if(m_BufferNoComment[templatePos-1]!=' ' 
      && m_BufferNoComment[templatePos-1]!='\n')
      {
      valid = false;
      }
    else if(m_BufferNoComment[templatePos+8]!=' ' 
         && m_BufferNoComment[templatePos+8]!='\n')
      {
      valid = false;
      }

    // Definition is template <whatever name,whatever name2 = test, ...>
      auto inf =
          static_cast<long int>(m_BufferNoComment.find("<", templatePos));
      auto sup = static_cast<long int>(m_BufferNoComment.find(">", inf));

      if (inf == -1 || sup == -1) {
        // std::cout << "CheckTemplate(): There is a problem parsing the file"
        // << std::endl;
        valid = false;
      }
    else
      {
      for(long int p=templatePos+8;p<inf;p++)
        {
        if(m_BufferNoComment[p]!=' ' && m_BufferNoComment[p]!='\n'
           && m_BufferNoComment[p]!='\r')
          {
          valid = false;
          break;
          }
        }
      }



    if(!valid)
      {
      templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));
      continue;
      }

    long int i = inf+1;
    bool inWord = false;
    bool afterEqual = false;
    int level = 0;
    std::string currentWord = "";

    while(i<=sup)
      {
      if(m_BufferNoComment[i] == '<')
        {
        level++;
        }

      // If we have a space
      if(m_BufferNoComment[i] == ' ')
        {
        // do nothing
        inWord = false;
        }
      else if(m_BufferNoComment[i] == ',' || m_BufferNoComment[i] == '>' || m_BufferNoComment[i] == '=')
        {
        inWord = false;

        if (!currentWord.empty() && !afterEqual && !regex.find(currentWord) &&
            level == 0) {
          Error error;
          error.line = this->GetLineNumber(i,true);
          error.line2 = error.line;
          error.number = TEMPLATE;
          error.description = "Template definition (" + currentWord + ") doesn't match regular expression";
          m_ErrorList.push_back(error);
          hasErrors = true;
        }

        if(m_BufferNoComment[i] == '=')
          {
          afterEqual = true;
          }
        else
          {
          afterEqual = false;
          }
        }
      else
        {
        if(!inWord)
          {
          currentWord = "";
          }
        currentWord += m_BufferNoComment[i];
        inWord = true;
        }

       if(m_BufferNoComment[i] == '>')
        {
        level--;
        }
      i++;
      }

    templatePos = static_cast<long int>(m_BufferNoComment.find("template",templatePos+1));  
    }

  return !hasErrors;
}